

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.cpp
# Opt level: O0

ostream * arangodb::velocypack::operator<<(ostream *stream,HexDump *hexdump)

{
  HexDump *in_RDI;
  string local_30 [40];
  HexDump *pHVar1;
  
  pHVar1 = in_RDI;
  HexDump::toString_abi_cxx11_(in_RDI);
  std::operator<<((ostream *)in_RDI,local_30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return (ostream *)pHVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, HexDump const& hexdump) {
  stream << hexdump.toString();
  return stream;
}